

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O1

void __thiscall WSNTopologyBasedEnergy::NodeSentSignalVarPower(WSNTopologyBasedEnergy *this)

{
  double *pdVar1;
  Scalar *pSVar2;
  double dVar3;
  double dVar4;
  Size SVar5;
  Size SVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Size SVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Size SVar12;
  Size SVar13;
  undefined8 uVar14;
  Size SVar15;
  Size SVar16;
  Size SVar17;
  undefined1 auVar18 [8];
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int i;
  ulong uVar25;
  int j;
  ulong uVar26;
  long lVar27;
  int iVar28;
  WSNTopologyBasedEnergy *pWVar29;
  WSNTopologyBasedEnergy *pWVar30;
  WSNNode *pWVar31;
  WSNNode *pWVar32;
  ulong in_stack_fffffffffffff8b8;
  WSNNode *pWVar33;
  WSNNode *pWVar34;
  int *piStack_738;
  int *piStack_728;
  undefined1 auStack_720 [8];
  undefined8 uStack_718;
  undefined1 auStack_710 [8];
  undefined1 auStack_708 [8];
  Size SStack_700;
  Size SStack_6f8;
  WSNTopologyBasedEnergy *pWStack_6f0;
  Size SStack_6e8;
  WSNTopologyBasedEnergy *pWStack_6e0;
  Size SStack_6d8;
  WSNNode *pWStack_6d0;
  WSNNode *pWStack_6c8;
  Scalar *pSStack_6c0;
  WSNNode *pWStack_6b8;
  Scalar *pSStack_6b0;
  undefined8 uStack_6a8;
  WSNNode *pWStack_6a0;
  WSNNode *pWStack_698;
  Size *pSStack_690;
  WSNNode *pWStack_688;
  vector<int,_std::allocator<int>_> vStack_680;
  double dStack_668;
  double dStack_660;
  double dStack_658;
  double dStack_650;
  Size SStack_648;
  double dStack_640;
  undefined8 uStack_638;
  Size SStack_630;
  Size SStack_628;
  Size SStack_620;
  Size SStack_618;
  WSNNode WStack_608;
  undefined8 uStack_5c8;
  double dStack_5c0;
  double dStack_5b8;
  Size SStack_5b0;
  double dStack_5a8;
  double dStack_5a0;
  double dStack_598;
  undefined1 auStack_588 [24];
  Size SStack_570;
  double dStack_568;
  double dStack_560;
  double dStack_558;
  Size SStack_548;
  Size SStack_540;
  Size SStack_538;
  Size SStack_530;
  double dStack_528;
  double dStack_520;
  double dStack_518;
  undefined8 uStack_508;
  double dStack_500;
  double dStack_4f8;
  Size SStack_4f0;
  double dStack_4e8;
  double dStack_4e0;
  double dStack_4d8;
  Size SStack_4c8;
  Size SStack_4c0;
  Size SStack_4b8;
  Size SStack_4b0;
  double dStack_4a8;
  double dStack_4a0;
  double dStack_498;
  undefined8 uStack_488;
  double dStack_480;
  double dStack_478;
  Size SStack_470;
  double dStack_468;
  double dStack_460;
  double dStack_458;
  Size SStack_448;
  double dStack_440;
  undefined8 uStack_438;
  Size SStack_430;
  Size SStack_428;
  Size SStack_420;
  Size SStack_418;
  undefined8 uStack_408;
  double dStack_400;
  double dStack_3f8;
  Size SStack_3f0;
  double dStack_3e8;
  double dStack_3e0;
  double dStack_3d8;
  double *apdStack_3c8 [2];
  double adStack_3b8 [10];
  Size SStack_368;
  Size SStack_360;
  undefined8 uStack_358;
  Size SStack_350;
  double dStack_348;
  double dStack_340;
  double dStack_338;
  undefined8 uStack_328;
  double dStack_320;
  double dStack_318;
  double dStack_310;
  double dStack_308;
  double dStack_300;
  double dStack_2f8;
  Size SStack_2e8;
  double dStack_2e0;
  double dStack_2d8;
  Size SStack_2d0;
  double dStack_2c8;
  double dStack_2c0;
  double dStack_2b8;
  undefined8 uStack_2a8;
  double dStack_2a0;
  double dStack_298;
  double dStack_290;
  double dStack_288;
  double dStack_280;
  double dStack_278;
  Size SStack_268;
  double dStack_260;
  double dStack_258;
  Size SStack_250;
  double dStack_248;
  double dStack_240;
  double dStack_238;
  undefined8 uStack_228;
  double dStack_220;
  undefined1 auStack_218 [24];
  double dStack_200;
  double dStack_1f8;
  Size SStack_1e8;
  double dStack_1e0;
  double dStack_1d8;
  Size SStack_1d0;
  double dStack_1c8;
  double dStack_1c0;
  double dStack_1b8;
  WSNNode WStack_1a8;
  Size SStack_168;
  double dStack_160;
  double dStack_158;
  Size SStack_150;
  double dStack_148;
  double dStack_140;
  double dStack_138;
  undefined1 auStack_128 [24];
  double dStack_110;
  double dStack_108;
  double dStack_100;
  double dStack_f8;
  double dStack_e8;
  double dStack_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  double dStack_80;
  double dStack_78;
  undefined1 auStack_70 [64];
  
  iVar22 = this->Mark[0];
  uVar25 = 0;
  uVar26 = 0;
  iVar28 = iVar22;
  do {
    if (this->Mark[uVar25] < iVar28) {
      uVar26 = uVar25 & 0xffffffff;
      iVar28 = this->Mark[uVar25];
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  if ((int)uVar26 == 0) {
    SelectServalNode(&vStack_680,this);
    piStack_738 = vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pWVar32 = this->LayerLeaderNode;
      pWVar33 = this->node;
      pWStack_698 = this->LayerLeaderNode + 4;
      pWStack_6a0 = (WSNNode *)&this->LayerLeaderNode[4].color;
      pWStack_6d0 = this->LayerLeaderNode + 3;
      pWStack_6c8 = (WSNNode *)&this->LayerLeaderNode[3].color;
      SStack_6d8 = (Size)(this->LayerLeaderNode + 1);
      pWStack_6e0 = (WSNTopologyBasedEnergy *)(this->LayerLeaderNode + 2);
      pSStack_6c0 = &this->LayerLeaderNode[2].color;
      pWStack_6b8 = (WSNNode *)&this->LayerLeaderNode[1].color;
      pSStack_6b0 = &this->LayerLeaderNode[0].color;
      pWStack_688 = &this->sink;
      pSStack_690 = (Size *)&(this->sink).color;
      do {
        cv::Mat::clone();
        SelectLeaderID(this);
        auStack_710._0_4_ = 0;
        auStack_710._4_4_ = 0;
        auStack_720._0_4_ = 0x3010000;
        dStack_650 = 0.0;
        dStack_658 = *(double *)this->LayerLeaderNode;
        auStack_708._0_4_ = 0;
        auStack_708._4_4_ = 0x40468000;
        SStack_700.width = 0;
        SStack_700.height = 0x4062c000;
        SStack_6f8.width = 0;
        SStack_6f8.height = 0x40468000;
        pWStack_6f0 = (WSNTopologyBasedEnergy *)0x0;
        uStack_718 = (WSNTopologyBasedEnergy *)apdStack_3c8;
        cv::line(auStack_720,&dStack_650,&dStack_658,(Size *)auStack_708,1,8,0);
        lVar27 = 0x1924;
        pWVar31 = pWVar33;
        do {
          auStack_710._0_4_ = 0;
          auStack_710._4_4_ = 0;
          auStack_720._0_4_ = 0x3010000;
          dStack_660 = *(double *)((long)this + lVar27 + -0x3c);
          dStack_668 = *(double *)((long)this + lVar27 + -4);
          auStack_708._0_4_ = 0;
          auStack_708._4_4_ = 0;
          SStack_700.width = 0;
          SStack_700.height = 0x406fe000;
          SStack_6f8.width = 0;
          SStack_6f8.height = 0;
          pWStack_6f0 = (WSNTopologyBasedEnergy *)0x0;
          uStack_718 = (WSNTopologyBasedEnergy *)apdStack_3c8;
          cv::line(auStack_720,&dStack_660,&dStack_668,(Size *)auStack_708,1,8,0);
          auStack_708 = (undefined1  [8])&SStack_6f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)auStack_708,"WSN","");
          auStack_710._0_4_ = 0;
          auStack_710._4_4_ = 0;
          auStack_720._0_4_ = 0x1010000;
          uStack_718 = (WSNTopologyBasedEnergy *)apdStack_3c8;
          cv::imshow((string *)auStack_708,(_InputArray *)auStack_720);
          if (auStack_708 != (undefined1  [8])&SStack_6f8) {
            operator_delete((void *)auStack_708,(ulong)((long)SStack_6f8 + 1));
          }
          lVar27 = lVar27 + 0x38;
        } while (lVar27 != 0x1a04);
        if (this->Test != false) {
          cv::waitKey(100);
        }
        iVar22 = WSNNode::layer(pWVar31 + *piStack_738);
        if (iVar22 == 0) {
          dVar3 = this->alpha;
          dStack_3f8 = *(double *)&this->LayerLeaderNode[0].leaderID;
          dVar4 = *(double *)pWVar32;
          dStack_400 = this->LayerLeaderNode[0].energy;
          SStack_3f0 = (Size)(pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_3e8 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_3e0 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_3d8 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_438._0_4_ = pWStack_688->leaderID;
          uStack_438._4_4_ = pWStack_688->id;
          SVar6.width = pWStack_688->x;
          SVar6.height = pWStack_688->y;
          dStack_440 = pWStack_688->energy;
          SStack_430 = *pSStack_690;
          SStack_428 = pSStack_690[1];
          SStack_420 = pSStack_690[2];
          SStack_418 = pSStack_690[3];
          uStack_408._0_4_ = SUB84(dVar4,0);
          iVar22 = (int)uStack_408;
          uStack_408._4_4_ = (int)((ulong)dVar4 >> 0x20);
          iVar28 = uStack_408._4_4_;
          SStack_448 = SVar6;
          uStack_408 = dVar4;
          iVar23 = WSNNode::GetNodeID(pWVar32);
          pWVar31[iVar23].energy =
               pWVar31[iVar23].energy -
               (dVar3 * (double)((iVar22 - SVar6.width) * (iVar22 - SVar6.width) +
                                (iVar28 - SVar6.height) * (iVar28 - SVar6.height)) + 1.0);
          pWVar33 = pWVar31;
          WSNNode::~WSNNode((WSNNode *)&SStack_448);
          WSNNode::~WSNNode((WSNNode *)&uStack_408);
          iVar22 = *piStack_738;
          auStack_128._16_8_ = *(undefined8 *)&pWVar31[iVar22].leaderID;
          pWVar34 = pWVar31 + iVar22;
          auStack_128._0_4_ = pWVar34->x;
          auStack_128._4_4_ = pWVar34->y;
          auStack_128._8_8_ = pWVar34->energy;
          dStack_110 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          dStack_108 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
          pdVar1 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          dStack_100 = *pdVar1;
          dStack_f8 = pdVar1[1];
          dStack_158 = *(double *)&this->LayerLeaderNode[0].leaderID;
          SStack_168.width = pWVar32->x;
          SStack_168.height = pWVar32->y;
          dStack_160 = this->LayerLeaderNode[0].energy;
          SStack_150 = (Size)(pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_148 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_140 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_138 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          pWVar31[*piStack_738].energy =
               pWVar31[*piStack_738].energy -
               ((double)((auStack_128._4_4_ - SStack_168.height) *
                         (auStack_128._4_4_ - SStack_168.height) +
                        (auStack_128._0_4_ - SStack_168.width) *
                        (auStack_128._0_4_ - SStack_168.width)) * this->alpha + 0.5);
          WSNNode::~WSNNode((WSNNode *)&SStack_168);
          WSNNode::~WSNNode((WSNNode *)auStack_128);
        }
        else {
          iVar22 = WSNNode::layer(pWVar31 + *piStack_738);
          SVar6 = SStack_6d8;
          if (iVar22 == 1) {
            dVar3 = this->alpha;
            dStack_478 = *(double *)((long)SStack_6d8 + 0x10);
            dVar4 = *(double *)SStack_6d8;
            dStack_480 = *(double *)((long)SStack_6d8 + 8);
            SStack_470.width = pWStack_6b8->x;
            SStack_470.height = pWStack_6b8->y;
            dStack_468 = pWStack_6b8->energy;
            dStack_460 = *(double *)&pWStack_6b8->leaderID;
            dStack_458 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
            SStack_4b8.width = this->LayerLeaderNode[0].leaderID;
            SStack_4b8.height = this->LayerLeaderNode[0].id;
            SVar5.width = pWVar32->x;
            SVar5.height = pWVar32->y;
            SStack_4c0 = (Size)this->LayerLeaderNode[0].energy;
            SStack_4b0 = (Size)(pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            dStack_4a8 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            dStack_4a0 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            dStack_498 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            uStack_488._0_4_ = SUB84(dVar4,0);
            iVar22 = (int)uStack_488;
            uStack_488._4_4_ = (int)((ulong)dVar4 >> 0x20);
            iVar28 = uStack_488._4_4_;
            uStack_6a8 = (WSNNode *)CONCAT44(SVar5.height,(undefined4)uStack_6a8);
            SStack_4c8 = SVar5;
            uStack_488 = dVar4;
            iVar23 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
            pWVar31[iVar23].energy =
                 pWVar31[iVar23].energy -
                 (dVar3 * (double)((iVar22 - SVar5.width) * (iVar22 - SVar5.width) +
                                  (iVar28 - uStack_6a8._4_4_) * (iVar28 - uStack_6a8._4_4_)) + 1.0);
            pWVar34 = pWVar31;
            WSNNode::~WSNNode((WSNNode *)&SStack_4c8);
            WSNNode::~WSNNode((WSNNode *)&uStack_488);
            iVar22 = *piStack_738;
            WStack_1a8.leaderID = pWVar31[iVar22].leaderID;
            WStack_1a8.id = pWVar31[iVar22].id;
            pWVar33 = pWVar31 + iVar22;
            WStack_1a8.x = pWVar33->x;
            WStack_1a8.y = pWVar33->y;
            WStack_1a8.energy = pWVar33->energy;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
            pdVar1 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar1;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar1[1];
            dStack_1d8 = *(double *)((long)SVar6 + 0x10);
            SStack_1e8 = *(Size *)SVar6;
            dStack_1e0 = *(double *)((long)SVar6 + 8);
            SStack_1d0.width = pWStack_6b8->x;
            SStack_1d0.height = pWStack_6b8->y;
            dStack_1c8 = pWStack_6b8->energy;
            dStack_1c0 = *(double *)&pWStack_6b8->leaderID;
            dStack_1b8 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
            pWVar31[*piStack_738].energy =
                 pWVar31[*piStack_738].energy -
                 ((double)((WStack_1a8.y - SStack_1e8.height) * (WStack_1a8.y - SStack_1e8.height) +
                          (WStack_1a8.x - SStack_1e8.width) * (WStack_1a8.x - SStack_1e8.width)) *
                  this->alpha + 0.5);
            WSNNode::~WSNNode((WSNNode *)&SStack_1e8);
            WSNNode::~WSNNode(&WStack_1a8);
            iVar22 = WSNNode::GetNodeID(pWVar32);
            pWVar31 = pWVar34;
          }
          else {
            iVar22 = WSNNode::layer(pWVar31 + *piStack_738);
            if (iVar22 == 2) {
              dVar3 = this->alpha;
              dStack_4f8 = *(double *)&pWStack_6e0->field_0x10;
              dVar4 = *(double *)pWStack_6e0;
              dStack_500 = *(double *)&pWStack_6e0->field_0x8;
              SStack_4f0 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0]
              ;
              dStack_4e8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_4e0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_4d8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              SStack_538 = *(Size *)((long)SStack_6d8 + 0x10);
              SStack_548 = *(Size *)SStack_6d8;
              SStack_540 = *(Size *)((long)SStack_6d8 + 8);
              SStack_530.width = pWStack_6b8->x;
              SStack_530.height = pWStack_6b8->y;
              dStack_528 = pWStack_6b8->energy;
              dStack_520 = *(double *)&pWStack_6b8->leaderID;
              dStack_518 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]
              ;
              uStack_508._0_4_ = SUB84(dVar4,0);
              iVar23 = (int)uStack_508;
              uStack_508._4_4_ = (int)((ulong)dVar4 >> 0x20);
              iVar21 = uStack_508._4_4_;
              iVar22 = SStack_548.width;
              iVar28 = SStack_548.height;
              uStack_508 = dVar4;
              iVar24 = WSNNode::GetNodeID((WSNNode *)pWStack_6e0);
              pWVar31[iVar24].energy =
                   pWVar31[iVar24].energy -
                   (dVar3 * (double)((iVar23 - iVar22) * (iVar23 - iVar22) +
                                    (iVar21 - iVar28) * (iVar21 - iVar28)) + 1.0);
              pWVar33 = pWVar31;
              WSNNode::~WSNNode((WSNNode *)&SStack_548);
              WSNNode::~WSNNode((WSNNode *)&uStack_508);
              iVar22 = *piStack_738;
              auStack_218._0_4_ = pWVar31[iVar22].leaderID;
              auStack_218._4_4_ = pWVar31[iVar22].id;
              dVar3 = *(double *)(pWVar31 + iVar22);
              dStack_220 = pWVar31[iVar22].energy;
              auStack_218._8_8_ =
                   pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
              auStack_218._16_8_ =
                   pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
              pdVar1 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
              dStack_200 = *pdVar1;
              dStack_1f8 = pdVar1[1];
              dStack_258 = *(double *)&pWStack_6e0->field_0x10;
              SStack_268 = *(Size *)pWStack_6e0;
              dStack_260 = *(double *)&pWStack_6e0->field_0x8;
              SStack_250 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0]
              ;
              dStack_248 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_240 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_238 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_228._0_4_ = SUB84(dVar3,0);
              uStack_228._4_4_ = (int)((ulong)dVar3 >> 0x20);
              pWVar31[*piStack_738].energy =
                   pWVar31[*piStack_738].energy -
                   ((double)((uStack_228._4_4_ - SStack_268.height) *
                             (uStack_228._4_4_ - SStack_268.height) +
                            ((int)uStack_228 - SStack_268.width) *
                            ((int)uStack_228 - SStack_268.width)) * this->alpha + 0.5);
              uStack_228 = dVar3;
              WSNNode::~WSNNode((WSNNode *)&SStack_268);
              WSNNode::~WSNNode((WSNNode *)&uStack_228);
              iVar22 = WSNNode::GetNodeID(pWVar32);
              pWVar33[iVar22].energy = pWVar33[iVar22].energy + -1.0;
              iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
              pWVar31 = pWVar33;
            }
            else {
              iVar22 = WSNNode::layer(pWVar31 + *piStack_738);
              if (iVar22 == 3) {
                dVar3 = this->alpha;
                auStack_588._16_8_ = *(undefined8 *)&pWStack_6d0->leaderID;
                uVar7._0_4_ = pWStack_6d0->x;
                uVar7._4_4_ = pWStack_6d0->y;
                auStack_588._8_8_ = pWStack_6d0->energy;
                SStack_570.width = pWStack_6c8->x;
                SStack_570.height = pWStack_6c8->y;
                dStack_568 = pWStack_6c8->energy;
                dStack_560 = *(double *)&pWStack_6c8->leaderID;
                dStack_558 = (pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [0];
                dStack_5b8 = *(double *)&pWStack_6e0->field_0x10;
                dVar4 = *(double *)pWStack_6e0;
                dStack_5c0 = *(double *)&pWStack_6e0->field_0x8;
                SStack_5b0 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val
                                   [0];
                dStack_5a8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_5a0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_598 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_5c8._0_4_ = SUB84(dVar4,0);
                iVar22 = (int)uStack_5c8;
                uStack_5c8._4_4_ = (int)((ulong)dVar4 >> 0x20);
                iVar28 = uStack_5c8._4_4_;
                uStack_5c8 = dVar4;
                auStack_588._0_8_ = uVar7;
                iVar23 = WSNNode::GetNodeID(pWStack_6d0);
                pWVar31[iVar23].energy =
                     pWVar31[iVar23].energy -
                     (dVar3 * (double)(((int)uVar7 - iVar22) * ((int)uVar7 - iVar22) +
                                      (uVar7._4_4_ - iVar28) * (uVar7._4_4_ - iVar28)) + 1.0);
                pWVar33 = pWVar31;
                WSNNode::~WSNNode((WSNNode *)&uStack_5c8);
                WSNNode::~WSNNode((WSNNode *)auStack_588);
                iVar22 = *piStack_738;
                dStack_298 = *(double *)&pWVar31[iVar22].leaderID;
                dVar3 = *(double *)(pWVar31 + iVar22);
                dStack_2a0 = pWVar31[iVar22].energy;
                dStack_290 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [0];
                dStack_288 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [1];
                pdVar1 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2
                ;
                dStack_280 = *pdVar1;
                dStack_278 = pdVar1[1];
                dStack_2d8 = *(double *)&pWStack_6d0->leaderID;
                SStack_2e8.width = pWStack_6d0->x;
                SStack_2e8.height = pWStack_6d0->y;
                dStack_2e0 = pWStack_6d0->energy;
                SStack_2d0.width = pWStack_6c8->x;
                SStack_2d0.height = pWStack_6c8->y;
                dStack_2c8 = pWStack_6c8->energy;
                dStack_2c0 = *(double *)&pWStack_6c8->leaderID;
                dStack_2b8 = (pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [0];
                uStack_2a8._0_4_ = SUB84(dVar3,0);
                uStack_2a8._4_4_ = (int)((ulong)dVar3 >> 0x20);
                pWVar31[*piStack_738].energy =
                     pWVar31[*piStack_738].energy -
                     ((double)((uStack_2a8._4_4_ - SStack_2e8.height) *
                               (uStack_2a8._4_4_ - SStack_2e8.height) +
                              ((int)uStack_2a8 - SStack_2e8.width) *
                              ((int)uStack_2a8 - SStack_2e8.width)) * this->alpha + 0.5);
                uStack_2a8 = dVar3;
                WSNNode::~WSNNode((WSNNode *)&SStack_2e8);
                WSNNode::~WSNNode((WSNNode *)&uStack_2a8);
                iVar22 = WSNNode::GetNodeID(pWVar32);
                pWVar33[iVar22].energy = pWVar33[iVar22].energy + -1.0;
                iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
                pWVar33[iVar22].energy = pWVar33[iVar22].energy + -1.0;
                iVar22 = WSNNode::GetNodeID((WSNNode *)pWStack_6e0);
                pWVar31 = pWVar33;
              }
              else {
                dVar3 = this->alpha;
                WStack_608.leaderID = pWStack_698->leaderID;
                WStack_608.id = pWStack_698->id;
                uVar8._0_4_ = pWStack_698->x;
                uVar8._4_4_ = pWStack_698->y;
                WStack_608.energy = pWStack_698->energy;
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ =
                     pWStack_6a0->x;
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_ =
                     pWStack_6a0->y;
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     pWStack_6a0->energy;
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                     *(double *)&pWStack_6a0->leaderID;
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                     (pWStack_6a0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
                uStack_638._0_4_ = pWStack_6d0->leaderID;
                uStack_638._4_4_ = pWStack_6d0->id;
                SVar9.width = pWStack_6d0->x;
                SVar9.height = pWStack_6d0->y;
                dStack_640 = pWStack_6d0->energy;
                SStack_630.width = pWStack_6c8->x;
                SStack_630.height = pWStack_6c8->y;
                SStack_628 = (Size)pWStack_6c8->energy;
                SStack_620.width = pWStack_6c8->leaderID;
                SStack_620.height = pWStack_6c8->id;
                SStack_618 = (Size)(pWStack_6c8->color).super_Vec<double,_4>.
                                   super_Matx<double,_4,_1>.val[0];
                SStack_648 = SVar9;
                WStack_608._0_8_ = uVar8;
                iVar22 = WSNNode::GetNodeID(pWStack_698);
                pWVar31[iVar22].energy =
                     pWVar31[iVar22].energy -
                     (dVar3 * (double)(((int)uVar8 - SVar9.width) * ((int)uVar8 - SVar9.width) +
                                      (uVar8._4_4_ - SVar9.height) * (uVar8._4_4_ - SVar9.height)) +
                     1.0);
                pWVar33 = pWVar31;
                WSNNode::~WSNNode((WSNNode *)&SStack_648);
                WSNNode::~WSNNode(&WStack_608);
                iVar22 = *piStack_738;
                dStack_318 = *(double *)&pWVar31[iVar22].leaderID;
                dVar3 = *(double *)(pWVar31 + iVar22);
                dStack_320 = pWVar31[iVar22].energy;
                dStack_310 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [0];
                dStack_308 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [1];
                pdVar1 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2
                ;
                dStack_300 = *pdVar1;
                dStack_2f8 = pdVar1[1];
                uStack_358._0_4_ = pWStack_698->leaderID;
                uStack_358._4_4_ = pWStack_698->id;
                SStack_368.width = pWStack_698->x;
                SStack_368.height = pWStack_698->y;
                SStack_360 = (Size)pWStack_698->energy;
                SStack_350.width = pWStack_6a0->x;
                SStack_350.height = pWStack_6a0->y;
                dStack_348 = pWStack_6a0->energy;
                dStack_340 = *(double *)&pWStack_6a0->leaderID;
                dStack_338 = (pWStack_6a0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [0];
                uStack_328._0_4_ = SUB84(dVar3,0);
                uStack_328._4_4_ = (int)((ulong)dVar3 >> 0x20);
                pWVar31[*piStack_738].energy =
                     pWVar31[*piStack_738].energy -
                     ((double)((uStack_328._4_4_ - SStack_368.height) *
                               (uStack_328._4_4_ - SStack_368.height) +
                              ((int)uStack_328 - SStack_368.width) *
                              ((int)uStack_328 - SStack_368.width)) * this->alpha + 0.5);
                uStack_328 = dVar3;
                WSNNode::~WSNNode((WSNNode *)&SStack_368);
                WSNNode::~WSNNode((WSNNode *)&uStack_328);
                iVar22 = WSNNode::GetNodeID(pWVar32);
                pWVar33[iVar22].energy = pWVar33[iVar22].energy + -1.0;
                iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
                pWVar33[iVar22].energy = pWVar33[iVar22].energy + -1.0;
                iVar22 = WSNNode::GetNodeID((WSNNode *)pWStack_6e0);
                pWVar33[iVar22].energy = pWVar33[iVar22].energy + -1.0;
                iVar22 = WSNNode::GetNodeID(pWStack_6d0);
                pWVar31 = pWVar33;
              }
            }
          }
          pWVar31[iVar22].energy = pWVar31[iVar22].energy + -1.0;
          pWVar33 = pWVar31;
        }
        iVar22 = *piStack_738;
        dStack_98 = *(double *)&pWVar31[iVar22].leaderID;
        dStack_a8 = *(double *)(pWVar31 + iVar22);
        dStack_a0 = pWVar31[iVar22].energy;
        dStack_90 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
        dStack_88 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
        pdVar1 = pWVar31[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        dStack_80 = *pdVar1;
        dStack_78 = pdVar1[1];
        pWVar30 = (WSNTopologyBasedEnergy *)(auStack_70 + 0x20);
        pWVar29 = pWVar30;
        WSNNode::NodeColor((Scalar *)pWVar30,pWVar31 + *piStack_738);
        drawCrossNode(pWVar29,&this->img,(WSNNode *)&dStack_a8,(Scalar *)pWVar30);
        WSNNode::~WSNNode((WSNNode *)&dStack_a8);
        auStack_708 = (undefined1  [8])&SStack_6f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)auStack_708,"WSN","");
        auStack_710._0_4_ = 0;
        auStack_710._4_4_ = 0;
        auStack_720._0_4_ = 0x1010000;
        uStack_718 = this;
        cv::imshow((string *)auStack_708,(_InputArray *)auStack_720);
        if (auStack_708 != (undefined1  [8])&SStack_6f8) {
          operator_delete((void *)auStack_708,(ulong)((long)SStack_6f8 + 1));
        }
        cv::Mat::~Mat((Mat *)apdStack_3c8);
        piStack_738 = piStack_738 + 1;
      } while (piStack_738 !=
               vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    pWVar32 = this->node;
    lVar27 = 100;
    do {
      dStack_d8 = *(double *)&pWVar32->leaderID;
      dStack_e8 = *(double *)pWVar32;
      dStack_e0 = pWVar32->energy;
      dStack_d0 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
      dStack_c8 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
      dStack_c0 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
      dStack_b8 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
      pWVar30 = (WSNTopologyBasedEnergy *)auStack_70;
      WSNNode::NodeColor((Scalar *)auStack_70,pWVar32);
      drawCrossNode(pWVar30,&this->img,(WSNNode *)&dStack_e8,(Scalar *)auStack_70);
      WSNNode::~WSNNode((WSNNode *)&dStack_e8);
      apdStack_3c8[0] = adStack_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)apdStack_3c8,"WSN","");
      SStack_6f8.width = 0;
      SStack_6f8.height = 0;
      auStack_708._0_4_ = 0x1010000;
      SStack_700 = (Size)this;
      cv::imshow((string *)apdStack_3c8,(_InputArray *)auStack_708);
      if (apdStack_3c8[0] != adStack_3b8) {
        operator_delete(apdStack_3c8[0],(long)adStack_3b8[0] + 1);
      }
      pWVar32 = pWVar32 + 1;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
    if (this->Test != false) {
      cv::waitKey(400);
    }
    if (vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  uVar25 = 0;
  uVar26 = 0;
  iVar28 = iVar22;
  do {
    if (this->Mark[uVar25] < iVar28) {
      uVar26 = uVar25 & 0xffffffff;
      iVar28 = this->Mark[uVar25];
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  if ((int)uVar26 == 1) {
    SelectServalNode(&vStack_680,this);
    piStack_738 = vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pWStack_688 = this->LayerLeaderNode;
      auStack_720 = (undefined1  [8])(this->LayerLeaderNode + 1);
      uStack_6a8 = this->LayerLeaderNode + 4;
      pSStack_6b0 = &this->LayerLeaderNode[4].color;
      pWStack_6d0 = this->LayerLeaderNode + 3;
      pSStack_6c0 = &this->LayerLeaderNode[3].color;
      SStack_6d8 = (Size)(this->LayerLeaderNode + 2);
      pWStack_6b8 = (WSNNode *)&this->LayerLeaderNode[2].color;
      pWStack_6c8 = (WSNNode *)&this->LayerLeaderNode[1].color;
      pSStack_690 = (Size *)&this->sink;
      pWStack_698 = (WSNNode *)&(this->sink).color;
      pWStack_6a0 = (WSNNode *)&this->LayerLeaderNode[0].color;
      do {
        cv::Mat::clone();
        SelectLeaderID(this);
        SStack_700.width = 0;
        SStack_700.height = 0;
        auStack_710._0_4_ = 0x3010000;
        dStack_650 = 0.0;
        dStack_658 = *(double *)(this->LayerLeaderNode + 1);
        SStack_6f8.width = 0;
        SStack_6f8.height = 0x40468000;
        pWStack_6f0 = (WSNTopologyBasedEnergy *)0x4062c00000000000;
        SStack_6e8.width = 0;
        SStack_6e8.height = 0x40468000;
        pWStack_6e0 = (WSNTopologyBasedEnergy *)0x0;
        in_stack_fffffffffffff8b8 = in_stack_fffffffffffff8b8 & 0xffffffff00000000;
        auStack_708 = (undefined1  [8])apdStack_3c8;
        cv::line((Size *)auStack_710,&dStack_650,&dStack_658,(_InputArray *)&SStack_6f8,1,8,
                 in_stack_fffffffffffff8b8);
        lVar27 = 0x1924;
        do {
          SStack_700.width = 0;
          SStack_700.height = 0;
          auStack_710._0_4_ = 0x3010000;
          dStack_660 = *(double *)((long)this + lVar27 + -0x3c);
          dStack_668 = *(double *)((long)this + lVar27 + -4);
          SStack_6f8.width = 0;
          SStack_6f8.height = 0;
          pWStack_6f0 = (WSNTopologyBasedEnergy *)0x406fe00000000000;
          SStack_6e8.width = 0;
          SStack_6e8.height = 0;
          pWStack_6e0 = (WSNTopologyBasedEnergy *)0x0;
          in_stack_fffffffffffff8b8 = in_stack_fffffffffffff8b8 & 0xffffffff00000000;
          auStack_708 = (undefined1  [8])apdStack_3c8;
          cv::line((Size *)auStack_710,&dStack_660,&dStack_668,(_InputArray *)&SStack_6f8,1,8,
                   in_stack_fffffffffffff8b8);
          SStack_6f8 = (Size)&SStack_6e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&SStack_6f8,"WSN","");
          SStack_700.width = 0;
          SStack_700.height = 0;
          auStack_710._0_4_ = 0x1010000;
          auStack_708 = (undefined1  [8])apdStack_3c8;
          cv::imshow((string *)&SStack_6f8,(_InputArray *)auStack_710);
          if (SStack_6f8 != (Size)&SStack_6e8) {
            operator_delete((void *)SStack_6f8,(long)SStack_6e8 + 1);
          }
          pWVar32 = pWStack_688;
          lVar27 = lVar27 + 0x38;
        } while (lVar27 != 0x1a04);
        if (this->Test != false) {
          cv::waitKey(100);
        }
        iVar22 = WSNNode::layer(this->node + *piStack_738);
        if (iVar22 == 0) {
          dVar3 = this->alpha;
          dStack_3f8 = *(double *)&pWVar32->leaderID;
          dVar4 = *(double *)pWVar32;
          dStack_400 = pWVar32->energy;
          SStack_3f0.width = pWStack_6a0->x;
          SStack_3f0.height = pWStack_6a0->y;
          dStack_3e8 = pWStack_6a0->energy;
          dStack_3e0 = *(double *)&pWStack_6a0->leaderID;
          dStack_3d8 = (pWStack_6a0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_438 = *(undefined8 *)((long)auStack_720 + 0x10);
          SStack_448 = *(Size *)auStack_720;
          dStack_440 = *(double *)((long)auStack_720 + 8);
          SStack_430.width = pWStack_6c8->x;
          SStack_430.height = pWStack_6c8->y;
          SStack_428 = (Size)pWStack_6c8->energy;
          SStack_420.width = pWStack_6c8->leaderID;
          SStack_420.height = pWStack_6c8->id;
          SStack_418 = (Size)(pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [0];
          uStack_408._0_4_ = SUB84(dVar4,0);
          iVar28 = (int)uStack_408;
          uStack_408._4_4_ = (int)((ulong)dVar4 >> 0x20);
          iVar23 = uStack_408._4_4_;
          iVar22 = SStack_448.width;
          uStack_718 = (WSNTopologyBasedEnergy *)CONCAT44(SStack_448.height,(int)uStack_718);
          uStack_408 = dVar4;
          iVar21 = WSNNode::GetNodeID(pWVar32);
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               (dVar3 * (double)((iVar28 - iVar22) * (iVar28 - iVar22) +
                                (iVar23 - uStack_718._4_4_) * (iVar23 - uStack_718._4_4_)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&SStack_448);
          WSNNode::~WSNNode((WSNNode *)&uStack_408);
          iVar22 = *piStack_738;
          auStack_128._16_8_ = *(undefined8 *)&this->node[iVar22].leaderID;
          pWVar33 = this->node + iVar22;
          auStack_128._0_4_ = pWVar33->x;
          auStack_128._4_4_ = pWVar33->y;
          auStack_128._8_8_ = pWVar33->energy;
          pSVar2 = &this->node[iVar22].color;
          dStack_110 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_108 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          dStack_100 = *pdVar1;
          dStack_f8 = pdVar1[1];
          dStack_158 = *(double *)&pWVar32->leaderID;
          SStack_168.width = pWVar32->x;
          SStack_168.height = pWVar32->y;
          dStack_160 = pWVar32->energy;
          SStack_150.width = pWStack_6a0->x;
          SStack_150.height = pWStack_6a0->y;
          dStack_148 = pWStack_6a0->energy;
          dStack_140 = *(double *)&pWStack_6a0->leaderID;
          dStack_138 = (pWStack_6a0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          this->node[*piStack_738].energy =
               this->node[*piStack_738].energy -
               ((double)((auStack_128._4_4_ - SStack_168.height) *
                         (auStack_128._4_4_ - SStack_168.height) +
                        (auStack_128._0_4_ - SStack_168.width) *
                        (auStack_128._0_4_ - SStack_168.width)) * this->alpha + 0.5);
          WSNNode::~WSNNode((WSNNode *)&SStack_168);
          WSNNode::~WSNNode((WSNNode *)auStack_128);
          iVar22 = WSNNode::GetNodeID((WSNNode *)auStack_720);
LAB_0010818a:
          this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
        }
        else {
          iVar22 = WSNNode::layer(this->node + *piStack_738);
          auVar18 = auStack_720;
          if (iVar22 != 1) {
            iVar22 = WSNNode::layer(this->node + *piStack_738);
            if (iVar22 == 2) {
              dVar3 = this->alpha;
              dStack_4f8 = *(double *)((long)SStack_6d8 + 0x10);
              dVar4 = *(double *)SStack_6d8;
              dStack_500 = *(double *)((long)SStack_6d8 + 8);
              SStack_4f0.width = pWStack_6b8->x;
              SStack_4f0.height = pWStack_6b8->y;
              dStack_4e8 = pWStack_6b8->energy;
              dStack_4e0 = *(double *)&pWStack_6b8->leaderID;
              dStack_4d8 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]
              ;
              SStack_538 = *(Size *)((long)auStack_720 + 0x10);
              SStack_548 = *(Size *)auStack_720;
              SStack_540 = *(Size *)((long)auStack_720 + 8);
              SStack_530.width = pWStack_6c8->x;
              SStack_530.height = pWStack_6c8->y;
              dStack_528 = pWStack_6c8->energy;
              dStack_520 = *(double *)&pWStack_6c8->leaderID;
              dStack_518 = (pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]
              ;
              uStack_508._0_4_ = SUB84(dVar4,0);
              iVar23 = (int)uStack_508;
              uStack_508._4_4_ = (int)((ulong)dVar4 >> 0x20);
              iVar21 = uStack_508._4_4_;
              iVar22 = SStack_548.width;
              iVar28 = SStack_548.height;
              uStack_508 = dVar4;
              iVar24 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
              this->node[iVar24].energy =
                   this->node[iVar24].energy -
                   (dVar3 * (double)((iVar23 - iVar22) * (iVar23 - iVar22) +
                                    (iVar21 - iVar28) * (iVar21 - iVar28)) + 1.0);
              WSNNode::~WSNNode((WSNNode *)&SStack_548);
              WSNNode::~WSNNode((WSNNode *)&uStack_508);
              iVar22 = *piStack_738;
              auStack_218._0_4_ = this->node[iVar22].leaderID;
              auStack_218._4_4_ = this->node[iVar22].id;
              dVar3 = *(double *)(this->node + iVar22);
              dStack_220 = this->node[iVar22].energy;
              pSVar2 = &this->node[iVar22].color;
              auStack_218._8_8_ = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              auStack_218._16_8_ = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              dStack_200 = *pdVar1;
              dStack_1f8 = pdVar1[1];
              dStack_258 = *(double *)((long)SStack_6d8 + 0x10);
              SStack_268 = *(Size *)SStack_6d8;
              dStack_260 = *(double *)((long)SStack_6d8 + 8);
              SStack_250.width = pWStack_6b8->x;
              SStack_250.height = pWStack_6b8->y;
              dStack_248 = pWStack_6b8->energy;
              dStack_240 = *(double *)&pWStack_6b8->leaderID;
              dStack_238 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]
              ;
              uStack_228._0_4_ = SUB84(dVar3,0);
              uStack_228._4_4_ = (int)((ulong)dVar3 >> 0x20);
              this->node[*piStack_738].energy =
                   this->node[*piStack_738].energy -
                   ((double)((uStack_228._4_4_ - SStack_268.height) *
                             (uStack_228._4_4_ - SStack_268.height) +
                            ((int)uStack_228 - SStack_268.width) *
                            ((int)uStack_228 - SStack_268.width)) * this->alpha + 0.5);
              uStack_228 = dVar3;
              WSNNode::~WSNNode((WSNNode *)&SStack_268);
              WSNNode::~WSNNode((WSNNode *)&uStack_228);
              iVar22 = WSNNode::GetNodeID((WSNNode *)auStack_720);
            }
            else {
              iVar22 = WSNNode::layer(this->node + *piStack_738);
              if (iVar22 == 3) {
                dVar3 = this->alpha;
                auStack_588._16_8_ = *(undefined8 *)&pWStack_6d0->leaderID;
                uVar10._0_4_ = pWStack_6d0->x;
                uVar10._4_4_ = pWStack_6d0->y;
                auStack_588._8_8_ = pWStack_6d0->energy;
                SStack_570 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val
                                   [0];
                dStack_568 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_560 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_558 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                dStack_5b8 = *(double *)((long)SStack_6d8 + 0x10);
                dVar4 = *(double *)SStack_6d8;
                dStack_5c0 = *(double *)((long)SStack_6d8 + 8);
                SStack_5b0.width = pWStack_6b8->x;
                SStack_5b0.height = pWStack_6b8->y;
                dStack_5a8 = pWStack_6b8->energy;
                dStack_5a0 = *(double *)&pWStack_6b8->leaderID;
                dStack_598 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                             [0];
                uStack_5c8._0_4_ = SUB84(dVar4,0);
                iVar22 = (int)uStack_5c8;
                uStack_5c8._4_4_ = (int)((ulong)dVar4 >> 0x20);
                iVar28 = uStack_5c8._4_4_;
                uStack_5c8 = dVar4;
                auStack_588._0_8_ = uVar10;
                iVar23 = WSNNode::GetNodeID(pWStack_6d0);
                this->node[iVar23].energy =
                     this->node[iVar23].energy -
                     (dVar3 * (double)(((int)uVar10 - iVar22) * ((int)uVar10 - iVar22) +
                                      (uVar10._4_4_ - iVar28) * (uVar10._4_4_ - iVar28)) + 1.0);
                WSNNode::~WSNNode((WSNNode *)&uStack_5c8);
                WSNNode::~WSNNode((WSNNode *)auStack_588);
                iVar22 = *piStack_738;
                dStack_298 = *(double *)&this->node[iVar22].leaderID;
                dVar3 = *(double *)(this->node + iVar22);
                dStack_2a0 = this->node[iVar22].energy;
                pSVar2 = &this->node[iVar22].color;
                dStack_290 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                dStack_288 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                         + 2;
                dStack_280 = *pdVar1;
                dStack_278 = pdVar1[1];
                dStack_2d8 = *(double *)&pWStack_6d0->leaderID;
                SStack_2e8.width = pWStack_6d0->x;
                SStack_2e8.height = pWStack_6d0->y;
                dStack_2e0 = pWStack_6d0->energy;
                SStack_2d0 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val
                                   [0];
                dStack_2c8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_2c0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_2b8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_2a8._0_4_ = SUB84(dVar3,0);
                uStack_2a8._4_4_ = (int)((ulong)dVar3 >> 0x20);
                this->node[*piStack_738].energy =
                     this->node[*piStack_738].energy -
                     ((double)((uStack_2a8._4_4_ - SStack_2e8.height) *
                               (uStack_2a8._4_4_ - SStack_2e8.height) +
                              ((int)uStack_2a8 - SStack_2e8.width) *
                              ((int)uStack_2a8 - SStack_2e8.width)) * this->alpha + 0.5);
                uStack_2a8 = dVar3;
                WSNNode::~WSNNode((WSNNode *)&SStack_2e8);
                WSNNode::~WSNNode((WSNNode *)&uStack_2a8);
                iVar22 = WSNNode::GetNodeID((WSNNode *)auStack_720);
                this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
                iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
              }
              else {
                dVar3 = this->alpha;
                WStack_608.leaderID = uStack_6a8->leaderID;
                WStack_608.id = uStack_6a8->id;
                uVar11._0_4_ = uStack_6a8->x;
                uVar11._4_4_ = uStack_6a8->y;
                WStack_608.energy = uStack_6a8->energy;
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                     (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                     (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_638._0_4_ = pWStack_6d0->leaderID;
                uStack_638._4_4_ = pWStack_6d0->id;
                SVar12.width = pWStack_6d0->x;
                SVar12.height = pWStack_6d0->y;
                dStack_640 = pWStack_6d0->energy;
                SStack_630 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val
                                   [0];
                SStack_628 = *(Size *)((pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.
                                       val + 1);
                SStack_620 = *(Size *)((pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.
                                       val + 2);
                SStack_618 = *(Size *)((pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.
                                       val + 3);
                SStack_648 = SVar12;
                WStack_608._0_8_ = uVar11;
                iVar22 = WSNNode::GetNodeID(uStack_6a8);
                this->node[iVar22].energy =
                     this->node[iVar22].energy -
                     (dVar3 * (double)(((int)uVar11 - SVar12.width) * ((int)uVar11 - SVar12.width) +
                                      (uVar11._4_4_ - SVar12.height) *
                                      (uVar11._4_4_ - SVar12.height)) + 1.0);
                WSNNode::~WSNNode((WSNNode *)&SStack_648);
                WSNNode::~WSNNode(&WStack_608);
                iVar22 = *piStack_738;
                dStack_318 = *(double *)&this->node[iVar22].leaderID;
                dVar3 = *(double *)(this->node + iVar22);
                dStack_320 = this->node[iVar22].energy;
                pSVar2 = &this->node[iVar22].color;
                dStack_310 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                dStack_308 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                         + 2;
                dStack_300 = *pdVar1;
                dStack_2f8 = pdVar1[1];
                uStack_358._0_4_ = uStack_6a8->leaderID;
                uStack_358._4_4_ = uStack_6a8->id;
                SStack_368.width = uStack_6a8->x;
                SStack_368.height = uStack_6a8->y;
                SStack_360 = (Size)uStack_6a8->energy;
                SStack_350 = (Size)(pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val
                                   [0];
                dStack_348 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_340 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_338 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_328._0_4_ = SUB84(dVar3,0);
                uStack_328._4_4_ = (int)((ulong)dVar3 >> 0x20);
                this->node[*piStack_738].energy =
                     this->node[*piStack_738].energy -
                     ((double)((uStack_328._4_4_ - SStack_368.height) *
                               (uStack_328._4_4_ - SStack_368.height) +
                              ((int)uStack_328 - SStack_368.width) *
                              ((int)uStack_328 - SStack_368.width)) * this->alpha + 0.5);
                uStack_328 = dVar3;
                WSNNode::~WSNNode((WSNNode *)&SStack_368);
                WSNNode::~WSNNode((WSNNode *)&uStack_328);
                iVar22 = WSNNode::GetNodeID((WSNNode *)auStack_720);
                this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
                iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
                this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
                iVar22 = WSNNode::GetNodeID(pWStack_6d0);
              }
            }
            goto LAB_0010818a;
          }
          dVar3 = this->alpha;
          dStack_478 = *(double *)((long)auStack_720 + 0x10);
          dVar4 = *(double *)auStack_720;
          dStack_480 = *(double *)((long)auStack_720 + 8);
          SStack_470.width = pWStack_6c8->x;
          SStack_470.height = pWStack_6c8->y;
          dStack_468 = pWStack_6c8->energy;
          dStack_460 = *(double *)&pWStack_6c8->leaderID;
          dStack_458 = (pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          SStack_4b8 = pSStack_690[2];
          SStack_4c8 = *pSStack_690;
          SStack_4c0 = pSStack_690[1];
          SStack_4b0.width = pWStack_698->x;
          SStack_4b0.height = pWStack_698->y;
          dStack_4a8 = pWStack_698->energy;
          dStack_4a0 = *(double *)&pWStack_698->leaderID;
          dStack_498 = (pWStack_698->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_488._0_4_ = SUB84(dVar4,0);
          iVar28 = (int)uStack_488;
          uStack_488._4_4_ = (int)((ulong)dVar4 >> 0x20);
          iVar23 = uStack_488._4_4_;
          iVar22 = SStack_4c8.width;
          uStack_718 = (WSNTopologyBasedEnergy *)CONCAT44(SStack_4c8.height,(int)uStack_718);
          uStack_488 = dVar4;
          iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_720);
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               (dVar3 * (double)((iVar28 - iVar22) * (iVar28 - iVar22) +
                                (iVar23 - uStack_718._4_4_) * (iVar23 - uStack_718._4_4_)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&SStack_4c8);
          WSNNode::~WSNNode((WSNNode *)&uStack_488);
          iVar22 = *piStack_738;
          WStack_1a8.leaderID = this->node[iVar22].leaderID;
          WStack_1a8.id = this->node[iVar22].id;
          pWVar32 = this->node + iVar22;
          WStack_1a8.x = pWVar32->x;
          WStack_1a8.y = pWVar32->y;
          WStack_1a8.energy = pWVar32->energy;
          pSVar2 = &this->node[iVar22].color;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar1;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar1[1];
          dStack_1d8 = *(double *)((long)auVar18 + 0x10);
          SStack_1e8 = *(Size *)auVar18;
          dStack_1e0 = *(double *)((long)auVar18 + 8);
          SStack_1d0.width = pWStack_6c8->x;
          SStack_1d0.height = pWStack_6c8->y;
          dStack_1c8 = pWStack_6c8->energy;
          dStack_1c0 = *(double *)&pWStack_6c8->leaderID;
          dStack_1b8 = (pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          this->node[*piStack_738].energy =
               this->node[*piStack_738].energy -
               ((double)((WStack_1a8.y - SStack_1e8.height) * (WStack_1a8.y - SStack_1e8.height) +
                        (WStack_1a8.x - SStack_1e8.width) * (WStack_1a8.x - SStack_1e8.width)) *
                this->alpha + 0.5);
          WSNNode::~WSNNode((WSNNode *)&SStack_1e8);
          WSNNode::~WSNNode(&WStack_1a8);
        }
        iVar22 = *piStack_738;
        dStack_98 = *(double *)&this->node[iVar22].leaderID;
        dStack_a8 = *(double *)(this->node + iVar22);
        dStack_a0 = this->node[iVar22].energy;
        pSVar2 = &this->node[iVar22].color;
        dStack_90 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        dStack_88 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        dStack_80 = *pdVar1;
        dStack_78 = pdVar1[1];
        pWVar30 = (WSNTopologyBasedEnergy *)(auStack_70 + 0x20);
        pWVar29 = pWVar30;
        WSNNode::NodeColor((Scalar *)pWVar30,this->node + *piStack_738);
        drawCrossNode(pWVar29,&this->img,(WSNNode *)&dStack_a8,(Scalar *)pWVar30);
        WSNNode::~WSNNode((WSNNode *)&dStack_a8);
        SStack_6f8 = (Size)&SStack_6e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&SStack_6f8,"WSN","");
        SStack_700.width = 0;
        SStack_700.height = 0;
        auStack_710._0_4_ = 0x1010000;
        auStack_708 = (undefined1  [8])this;
        cv::imshow((string *)&SStack_6f8,(_InputArray *)auStack_710);
        if (SStack_6f8 != (Size)&SStack_6e8) {
          operator_delete((void *)SStack_6f8,(long)SStack_6e8 + 1);
        }
        cv::Mat::~Mat((Mat *)apdStack_3c8);
        piStack_738 = piStack_738 + 1;
      } while (piStack_738 !=
               vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    pWVar32 = this->node;
    lVar27 = 100;
    do {
      dStack_d8 = *(double *)&pWVar32->leaderID;
      dStack_e8 = *(double *)pWVar32;
      dStack_e0 = pWVar32->energy;
      dStack_d0 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
      dStack_c8 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
      dStack_c0 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
      dStack_b8 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
      pWVar30 = (WSNTopologyBasedEnergy *)auStack_70;
      WSNNode::NodeColor((Scalar *)auStack_70,pWVar32);
      drawCrossNode(pWVar30,&this->img,(WSNNode *)&dStack_e8,(Scalar *)auStack_70);
      WSNNode::~WSNNode((WSNNode *)&dStack_e8);
      apdStack_3c8[0] = adStack_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)apdStack_3c8,"WSN","");
      SStack_6e8.width = 0;
      SStack_6e8.height = 0;
      SStack_6f8.width = 0x1010000;
      pWStack_6f0 = this;
      cv::imshow((string *)apdStack_3c8,(_InputArray *)&SStack_6f8);
      if (apdStack_3c8[0] != adStack_3b8) {
        operator_delete(apdStack_3c8[0],(long)adStack_3b8[0] + 1);
      }
      pWVar32 = pWVar32 + 1;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
    if (this->Test != false) {
      cv::waitKey(400);
    }
    if (vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  uVar25 = 0;
  uVar26 = 0;
  iVar28 = iVar22;
  do {
    if (this->Mark[uVar25] < iVar28) {
      uVar26 = uVar25 & 0xffffffff;
      iVar28 = this->Mark[uVar25];
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  if ((int)uVar26 == 2) {
    SelectServalNode(&vStack_680,this);
    piStack_738 = vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pWStack_688 = this->LayerLeaderNode;
      auStack_720 = (undefined1  [8])(this->LayerLeaderNode + 2);
      pWStack_6a0 = this->LayerLeaderNode + 4;
      pSStack_6b0 = &this->LayerLeaderNode[4].color;
      SStack_6d8 = (Size)(this->LayerLeaderNode + 3);
      pWStack_6c8 = (WSNNode *)&this->LayerLeaderNode[3].color;
      pWStack_6d0 = (WSNNode *)&this->LayerLeaderNode[2].color;
      pSStack_690 = (Size *)&this->sink;
      pWStack_698 = (WSNNode *)&(this->sink).color;
      pWStack_6b8 = this->LayerLeaderNode + 1;
      pSStack_6c0 = &this->LayerLeaderNode[1].color;
      uStack_6a8 = (WSNNode *)&this->LayerLeaderNode[0].color;
      do {
        cv::Mat::clone();
        SelectLeaderID(this);
        SStack_700.width = 0;
        SStack_700.height = 0;
        auStack_710._0_4_ = 0x3010000;
        dStack_650 = 0.0;
        dStack_658 = *(double *)(this->LayerLeaderNode + 2);
        SStack_6f8.width = 0;
        SStack_6f8.height = 0x40468000;
        pWStack_6f0 = (WSNTopologyBasedEnergy *)0x4062c00000000000;
        SStack_6e8.width = 0;
        SStack_6e8.height = 0x40468000;
        pWStack_6e0 = (WSNTopologyBasedEnergy *)0x0;
        in_stack_fffffffffffff8b8 = in_stack_fffffffffffff8b8 & 0xffffffff00000000;
        auStack_708 = (undefined1  [8])apdStack_3c8;
        cv::line((Size *)auStack_710,&dStack_650,&dStack_658,(_InputArray *)&SStack_6f8,1,8,
                 in_stack_fffffffffffff8b8);
        lVar27 = 0x1924;
        do {
          SStack_700.width = 0;
          SStack_700.height = 0;
          auStack_710._0_4_ = 0x3010000;
          dStack_660 = *(double *)((long)this + lVar27 + -0x3c);
          dStack_668 = *(double *)((long)this + lVar27 + -4);
          SStack_6f8.width = 0;
          SStack_6f8.height = 0;
          pWStack_6f0 = (WSNTopologyBasedEnergy *)0x406fe00000000000;
          SStack_6e8.width = 0;
          SStack_6e8.height = 0;
          pWStack_6e0 = (WSNTopologyBasedEnergy *)0x0;
          in_stack_fffffffffffff8b8 = in_stack_fffffffffffff8b8 & 0xffffffff00000000;
          auStack_708 = (undefined1  [8])apdStack_3c8;
          cv::line((Size *)auStack_710,&dStack_660,&dStack_668,(_InputArray *)&SStack_6f8,1,8,
                   in_stack_fffffffffffff8b8);
          SStack_6f8 = (Size)&SStack_6e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&SStack_6f8,"WSN","");
          SStack_700.width = 0;
          SStack_700.height = 0;
          auStack_710._0_4_ = 0x1010000;
          auStack_708 = (undefined1  [8])apdStack_3c8;
          cv::imshow((string *)&SStack_6f8,(_InputArray *)auStack_710);
          if (SStack_6f8 != (Size)&SStack_6e8) {
            operator_delete((void *)SStack_6f8,(long)SStack_6e8 + 1);
          }
          pWVar33 = pWStack_688;
          pWVar32 = pWStack_6a0;
          lVar27 = lVar27 + 0x38;
        } while (lVar27 != 0x1a04);
        if (this->Test != false) {
          cv::waitKey(100);
        }
        iVar22 = WSNNode::layer(this->node + *piStack_738);
        if (iVar22 == 0) {
          dVar3 = this->alpha;
          dStack_3f8 = *(double *)&pWVar33->leaderID;
          dVar4 = *(double *)pWVar33;
          dStack_400 = pWVar33->energy;
          SStack_3f0.width = uStack_6a8->x;
          SStack_3f0.height = uStack_6a8->y;
          dStack_3e8 = uStack_6a8->energy;
          dStack_3e0 = *(double *)&uStack_6a8->leaderID;
          dStack_3d8 = (uStack_6a8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_438._0_4_ = pWStack_6b8->leaderID;
          uStack_438._4_4_ = pWStack_6b8->id;
          SVar13.width = pWStack_6b8->x;
          SVar13.height = pWStack_6b8->y;
          dStack_440 = pWStack_6b8->energy;
          SStack_430 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          SStack_428 = *(Size *)((pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val +
                                1);
          SStack_420 = *(Size *)((pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val +
                                2);
          SStack_418 = *(Size *)((pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val +
                                3);
          uStack_408._0_4_ = SUB84(dVar4,0);
          iVar22 = (int)uStack_408;
          uStack_408._4_4_ = (int)((ulong)dVar4 >> 0x20);
          iVar28 = uStack_408._4_4_;
          uStack_718 = (WSNTopologyBasedEnergy *)CONCAT44(SVar13.height,(int)uStack_718);
          SStack_448 = SVar13;
          uStack_408 = dVar4;
          iVar23 = WSNNode::GetNodeID(pWVar33);
          this->node[iVar23].energy =
               this->node[iVar23].energy -
               (dVar3 * (double)((iVar22 - SVar13.width) * (iVar22 - SVar13.width) +
                                (iVar28 - uStack_718._4_4_) * (iVar28 - uStack_718._4_4_)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&SStack_448);
          WSNNode::~WSNNode((WSNNode *)&uStack_408);
          iVar22 = *piStack_738;
          auStack_128._16_8_ = *(undefined8 *)&this->node[iVar22].leaderID;
          pWVar32 = this->node + iVar22;
          auStack_128._0_4_ = pWVar32->x;
          auStack_128._4_4_ = pWVar32->y;
          auStack_128._8_8_ = pWVar32->energy;
          pSVar2 = &this->node[iVar22].color;
          dStack_110 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_108 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          dStack_100 = *pdVar1;
          dStack_f8 = pdVar1[1];
          dStack_158 = *(double *)&pWVar33->leaderID;
          SStack_168.width = pWVar33->x;
          SStack_168.height = pWVar33->y;
          dStack_160 = pWVar33->energy;
          SStack_150.width = uStack_6a8->x;
          SStack_150.height = uStack_6a8->y;
          dStack_148 = uStack_6a8->energy;
          dStack_140 = *(double *)&uStack_6a8->leaderID;
          dStack_138 = (uStack_6a8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          this->node[*piStack_738].energy =
               this->node[*piStack_738].energy -
               ((double)((auStack_128._4_4_ - SStack_168.height) *
                         (auStack_128._4_4_ - SStack_168.height) +
                        (auStack_128._0_4_ - SStack_168.width) *
                        (auStack_128._0_4_ - SStack_168.width)) * this->alpha + 0.5);
          WSNNode::~WSNNode((WSNNode *)&SStack_168);
          WSNNode::~WSNNode((WSNNode *)auStack_128);
          iVar22 = WSNNode::GetNodeID(pWStack_6b8);
          this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
          iVar22 = WSNNode::GetNodeID((WSNNode *)auStack_720);
LAB_00108c6d:
          this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
        }
        else {
          iVar22 = WSNNode::layer(this->node + *piStack_738);
          pWVar33 = pWStack_6b8;
          if (iVar22 == 1) {
            dVar3 = this->alpha;
            dStack_478 = *(double *)&pWStack_6b8->leaderID;
            dVar4 = *(double *)pWStack_6b8;
            dStack_480 = pWStack_6b8->energy;
            SStack_470 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            dStack_468 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            dStack_460 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            dStack_458 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            SStack_4b8 = *(Size *)((long)auStack_720 + 0x10);
            SStack_4c8 = *(Size *)auStack_720;
            SStack_4c0 = *(Size *)((long)auStack_720 + 8);
            SStack_4b0.width = pWStack_6d0->x;
            SStack_4b0.height = pWStack_6d0->y;
            dStack_4a8 = pWStack_6d0->energy;
            dStack_4a0 = *(double *)&pWStack_6d0->leaderID;
            dStack_498 = (pWStack_6d0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
            uStack_488._0_4_ = SUB84(dVar4,0);
            iVar28 = (int)uStack_488;
            uStack_488._4_4_ = (int)((ulong)dVar4 >> 0x20);
            iVar23 = uStack_488._4_4_;
            iVar22 = SStack_4c8.width;
            uStack_718 = (WSNTopologyBasedEnergy *)CONCAT44(SStack_4c8.height,(int)uStack_718);
            uStack_488 = dVar4;
            iVar21 = WSNNode::GetNodeID(pWStack_6b8);
            this->node[iVar21].energy =
                 this->node[iVar21].energy -
                 (dVar3 * (double)((iVar28 - iVar22) * (iVar28 - iVar22) +
                                  (iVar23 - uStack_718._4_4_) * (iVar23 - uStack_718._4_4_)) + 1.0);
            WSNNode::~WSNNode((WSNNode *)&SStack_4c8);
            WSNNode::~WSNNode((WSNNode *)&uStack_488);
            iVar22 = *piStack_738;
            WStack_1a8.leaderID = this->node[iVar22].leaderID;
            WStack_1a8.id = this->node[iVar22].id;
            pWVar32 = this->node + iVar22;
            WStack_1a8.x = pWVar32->x;
            WStack_1a8.y = pWVar32->y;
            WStack_1a8.energy = pWVar32->energy;
            pSVar2 = &this->node[iVar22].color;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar1;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar1[1];
            dStack_1d8 = *(double *)&pWVar33->leaderID;
            SStack_1e8.width = pWVar33->x;
            SStack_1e8.height = pWVar33->y;
            dStack_1e0 = pWVar33->energy;
            SStack_1d0 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            dStack_1c8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            dStack_1c0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            dStack_1b8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            this->node[*piStack_738].energy =
                 this->node[*piStack_738].energy -
                 ((double)((WStack_1a8.y - SStack_1e8.height) * (WStack_1a8.y - SStack_1e8.height) +
                          (WStack_1a8.x - SStack_1e8.width) * (WStack_1a8.x - SStack_1e8.width)) *
                  this->alpha + 0.5);
            WSNNode::~WSNNode((WSNNode *)&SStack_1e8);
            WSNNode::~WSNNode(&WStack_1a8);
            iVar22 = WSNNode::GetNodeID((WSNNode *)auStack_720);
            goto LAB_00108c6d;
          }
          iVar22 = WSNNode::layer(this->node + *piStack_738);
          if (iVar22 != 2) {
            iVar22 = WSNNode::layer(this->node + *piStack_738);
            if (iVar22 == 3) {
              dVar3 = this->alpha;
              auStack_588._16_8_ = *(undefined8 *)((long)SStack_6d8 + 0x10);
              auStack_588._0_8_ = *(undefined8 *)SStack_6d8;
              auStack_588._8_8_ = *(double *)((long)SStack_6d8 + 8);
              SStack_570.width = pWStack_6c8->x;
              SStack_570.height = pWStack_6c8->y;
              dStack_568 = pWStack_6c8->energy;
              dStack_560 = *(double *)&pWStack_6c8->leaderID;
              dStack_558 = (pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]
              ;
              dStack_5b8 = *(double *)((long)auStack_720 + 0x10);
              dVar4 = *(double *)auStack_720;
              dStack_5c0 = *(double *)((long)auStack_720 + 8);
              SStack_5b0.width = pWStack_6d0->x;
              SStack_5b0.height = pWStack_6d0->y;
              dStack_5a8 = pWStack_6d0->energy;
              dStack_5a0 = *(double *)&pWStack_6d0->leaderID;
              dStack_598 = (pWStack_6d0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]
              ;
              uVar19 = auStack_588._0_4_;
              uVar20 = auStack_588._4_4_;
              uStack_5c8._0_4_ = SUB84(dVar4,0);
              iVar22 = (int)uStack_5c8;
              uStack_5c8._4_4_ = (int)((ulong)dVar4 >> 0x20);
              iVar28 = uStack_5c8._4_4_;
              uStack_5c8 = dVar4;
              iVar23 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
              this->node[iVar23].energy =
                   this->node[iVar23].energy -
                   (dVar3 * (double)((uVar19 - iVar22) * (uVar19 - iVar22) +
                                    (uVar20 - iVar28) * (uVar20 - iVar28)) + 1.0);
              WSNNode::~WSNNode((WSNNode *)&uStack_5c8);
              WSNNode::~WSNNode((WSNNode *)auStack_588);
              iVar22 = *piStack_738;
              dStack_298 = *(double *)&this->node[iVar22].leaderID;
              dVar3 = *(double *)(this->node + iVar22);
              dStack_2a0 = this->node[iVar22].energy;
              pSVar2 = &this->node[iVar22].color;
              dStack_290 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              dStack_288 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              dStack_280 = *pdVar1;
              dStack_278 = pdVar1[1];
              dStack_2d8 = *(double *)((long)SStack_6d8 + 0x10);
              SStack_2e8 = *(Size *)SStack_6d8;
              dStack_2e0 = *(double *)((long)SStack_6d8 + 8);
              SStack_2d0.width = pWStack_6c8->x;
              SStack_2d0.height = pWStack_6c8->y;
              dStack_2c8 = pWStack_6c8->energy;
              dStack_2c0 = *(double *)&pWStack_6c8->leaderID;
              dStack_2b8 = (pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]
              ;
              uStack_2a8._0_4_ = SUB84(dVar3,0);
              uStack_2a8._4_4_ = (int)((ulong)dVar3 >> 0x20);
              this->node[*piStack_738].energy =
                   this->node[*piStack_738].energy -
                   ((double)((uStack_2a8._4_4_ - SStack_2e8.height) *
                             (uStack_2a8._4_4_ - SStack_2e8.height) +
                            ((int)uStack_2a8 - SStack_2e8.width) *
                            ((int)uStack_2a8 - SStack_2e8.width)) * this->alpha + 0.5);
              uStack_2a8 = dVar3;
              WSNNode::~WSNNode((WSNNode *)&SStack_2e8);
              WSNNode::~WSNNode((WSNNode *)&uStack_2a8);
              iVar22 = WSNNode::GetNodeID((WSNNode *)auStack_720);
            }
            else {
              dVar3 = this->alpha;
              WStack_608.leaderID = pWVar32->leaderID;
              WStack_608.id = pWVar32->id;
              uVar14._0_4_ = pWVar32->x;
              uVar14._4_4_ = pWVar32->y;
              WStack_608.energy = pWVar32->energy;
              WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_638 = *(undefined8 *)((long)SStack_6d8 + 0x10);
              SStack_648 = *(Size *)SStack_6d8;
              dStack_640 = *(double *)((long)SStack_6d8 + 8);
              SStack_630.width = pWStack_6c8->x;
              SStack_630.height = pWStack_6c8->y;
              SStack_628 = (Size)pWStack_6c8->energy;
              SStack_620.width = pWStack_6c8->leaderID;
              SStack_620.height = pWStack_6c8->id;
              SStack_618 = (Size)(pWStack_6c8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.
                                 val[0];
              iVar22 = SStack_648.width;
              iVar28 = SStack_648.height;
              WStack_608._0_8_ = uVar14;
              iVar23 = WSNNode::GetNodeID(pWVar32);
              this->node[iVar23].energy =
                   this->node[iVar23].energy -
                   (dVar3 * (double)(((int)uVar14 - iVar22) * ((int)uVar14 - iVar22) +
                                    (uVar14._4_4_ - iVar28) * (uVar14._4_4_ - iVar28)) + 1.0);
              WSNNode::~WSNNode((WSNNode *)&SStack_648);
              WSNNode::~WSNNode(&WStack_608);
              iVar22 = *piStack_738;
              dStack_318 = *(double *)&this->node[iVar22].leaderID;
              dVar3 = *(double *)(this->node + iVar22);
              dStack_320 = this->node[iVar22].energy;
              pSVar2 = &this->node[iVar22].color;
              dStack_310 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              dStack_308 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              dStack_300 = *pdVar1;
              dStack_2f8 = pdVar1[1];
              uStack_358._0_4_ = pWStack_6a0->leaderID;
              uStack_358._4_4_ = pWStack_6a0->id;
              SStack_368.width = pWStack_6a0->x;
              SStack_368.height = pWStack_6a0->y;
              SStack_360 = (Size)pWStack_6a0->energy;
              SStack_350 = (Size)(pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0]
              ;
              dStack_348 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_340 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_338 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_328._0_4_ = SUB84(dVar3,0);
              uStack_328._4_4_ = (int)((ulong)dVar3 >> 0x20);
              this->node[*piStack_738].energy =
                   this->node[*piStack_738].energy -
                   ((double)((uStack_328._4_4_ - SStack_368.height) *
                             (uStack_328._4_4_ - SStack_368.height) +
                            ((int)uStack_328 - SStack_368.width) *
                            ((int)uStack_328 - SStack_368.width)) * this->alpha + 0.5);
              uStack_328 = dVar3;
              WSNNode::~WSNNode((WSNNode *)&SStack_368);
              WSNNode::~WSNNode((WSNNode *)&uStack_328);
              iVar22 = WSNNode::GetNodeID((WSNNode *)auStack_720);
              this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
              iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6d8);
            }
            goto LAB_00108c6d;
          }
          dVar3 = this->alpha;
          dStack_4f8 = *(double *)((long)auStack_720 + 0x10);
          dVar4 = *(double *)auStack_720;
          dStack_500 = *(double *)((long)auStack_720 + 8);
          SStack_4f0.width = pWStack_6d0->x;
          SStack_4f0.height = pWStack_6d0->y;
          dStack_4e8 = pWStack_6d0->energy;
          dStack_4e0 = *(double *)&pWStack_6d0->leaderID;
          dStack_4d8 = (pWStack_6d0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          SStack_538 = pSStack_690[2];
          SStack_548 = *pSStack_690;
          SStack_540 = pSStack_690[1];
          SStack_530.width = pWStack_698->x;
          SStack_530.height = pWStack_698->y;
          dStack_528 = pWStack_698->energy;
          dStack_520 = *(double *)&pWStack_698->leaderID;
          dStack_518 = (pWStack_698->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_508._0_4_ = SUB84(dVar4,0);
          iVar23 = (int)uStack_508;
          uStack_508._4_4_ = (int)((ulong)dVar4 >> 0x20);
          iVar21 = uStack_508._4_4_;
          iVar22 = SStack_548.width;
          iVar28 = SStack_548.height;
          uStack_508 = dVar4;
          iVar24 = WSNNode::GetNodeID((WSNNode *)auStack_720);
          this->node[iVar24].energy =
               this->node[iVar24].energy -
               (dVar3 * (double)((iVar23 - iVar22) * (iVar23 - iVar22) +
                                (iVar21 - iVar28) * (iVar21 - iVar28)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&SStack_548);
          WSNNode::~WSNNode((WSNNode *)&uStack_508);
          iVar22 = *piStack_738;
          auStack_218._0_4_ = this->node[iVar22].leaderID;
          auStack_218._4_4_ = this->node[iVar22].id;
          dVar3 = *(double *)(this->node + iVar22);
          dStack_220 = this->node[iVar22].energy;
          pSVar2 = &this->node[iVar22].color;
          auStack_218._8_8_ = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          auStack_218._16_8_ = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          dStack_200 = *pdVar1;
          dStack_1f8 = pdVar1[1];
          dStack_258 = *(double *)((long)auStack_720 + 0x10);
          SStack_268 = *(Size *)auStack_720;
          dStack_260 = *(double *)((long)auStack_720 + 8);
          SStack_250.width = pWStack_6d0->x;
          SStack_250.height = pWStack_6d0->y;
          dStack_248 = pWStack_6d0->energy;
          dStack_240 = *(double *)&pWStack_6d0->leaderID;
          dStack_238 = (pWStack_6d0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_228._0_4_ = SUB84(dVar3,0);
          uStack_228._4_4_ = (int)((ulong)dVar3 >> 0x20);
          this->node[*piStack_738].energy =
               this->node[*piStack_738].energy -
               ((double)((uStack_228._4_4_ - SStack_268.height) *
                         (uStack_228._4_4_ - SStack_268.height) +
                        ((int)uStack_228 - SStack_268.width) * ((int)uStack_228 - SStack_268.width))
                * this->alpha + 0.5);
          uStack_228 = dVar3;
          WSNNode::~WSNNode((WSNNode *)&SStack_268);
          WSNNode::~WSNNode((WSNNode *)&uStack_228);
        }
        iVar22 = *piStack_738;
        dStack_98 = *(double *)&this->node[iVar22].leaderID;
        dStack_a8 = *(double *)(this->node + iVar22);
        dStack_a0 = this->node[iVar22].energy;
        pSVar2 = &this->node[iVar22].color;
        dStack_90 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        dStack_88 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        dStack_80 = *pdVar1;
        dStack_78 = pdVar1[1];
        pWVar30 = (WSNTopologyBasedEnergy *)(auStack_70 + 0x20);
        pWVar29 = pWVar30;
        WSNNode::NodeColor((Scalar *)pWVar30,this->node + *piStack_738);
        drawCrossNode(pWVar29,&this->img,(WSNNode *)&dStack_a8,(Scalar *)pWVar30);
        WSNNode::~WSNNode((WSNNode *)&dStack_a8);
        SStack_6f8 = (Size)&SStack_6e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&SStack_6f8,"WSN","");
        SStack_700.width = 0;
        SStack_700.height = 0;
        auStack_710._0_4_ = 0x1010000;
        auStack_708 = (undefined1  [8])this;
        cv::imshow((string *)&SStack_6f8,(_InputArray *)auStack_710);
        if (SStack_6f8 != (Size)&SStack_6e8) {
          operator_delete((void *)SStack_6f8,(long)SStack_6e8 + 1);
        }
        cv::Mat::~Mat((Mat *)apdStack_3c8);
        piStack_738 = piStack_738 + 1;
      } while (piStack_738 !=
               vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    pWVar32 = this->node;
    lVar27 = 100;
    do {
      dStack_d8 = *(double *)&pWVar32->leaderID;
      dStack_e8 = *(double *)pWVar32;
      dStack_e0 = pWVar32->energy;
      dStack_d0 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
      dStack_c8 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
      dStack_c0 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
      dStack_b8 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
      pWVar30 = (WSNTopologyBasedEnergy *)auStack_70;
      WSNNode::NodeColor((Scalar *)auStack_70,pWVar32);
      drawCrossNode(pWVar30,&this->img,(WSNNode *)&dStack_e8,(Scalar *)auStack_70);
      WSNNode::~WSNNode((WSNNode *)&dStack_e8);
      apdStack_3c8[0] = adStack_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)apdStack_3c8,"WSN","");
      SStack_6e8.width = 0;
      SStack_6e8.height = 0;
      SStack_6f8.width = 0x1010000;
      pWStack_6f0 = this;
      cv::imshow((string *)apdStack_3c8,(_InputArray *)&SStack_6f8);
      if (apdStack_3c8[0] != adStack_3b8) {
        operator_delete(apdStack_3c8[0],(long)adStack_3b8[0] + 1);
      }
      pWVar32 = pWVar32 + 1;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
    if (this->Test != false) {
      cv::waitKey(400);
    }
    if (vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  uVar25 = 0;
  uVar26 = 0;
  do {
    if (this->Mark[uVar25] < iVar22) {
      uVar26 = uVar25 & 0xffffffff;
      iVar22 = this->Mark[uVar25];
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 5);
  if ((int)uVar26 == 3) {
    TopLayer3SentSink(this);
    return;
  }
  SelectServalNode(&vStack_680,this);
  piStack_728 = vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pWStack_698 = this->LayerLeaderNode;
    SStack_6f8 = (Size)(this->LayerLeaderNode + 4);
    pWStack_6a0 = (WSNNode *)&this->LayerLeaderNode[4].color;
    pWStack_688 = &this->sink;
    pSStack_690 = (Size *)&(this->sink).color;
    pWStack_6f0 = (WSNTopologyBasedEnergy *)(this->LayerLeaderNode + 3);
    pSStack_6c0 = &this->LayerLeaderNode[3].color;
    pWStack_6d0 = this->LayerLeaderNode + 2;
    pWStack_6b8 = (WSNNode *)&this->LayerLeaderNode[2].color;
    pWStack_6c8 = this->LayerLeaderNode + 1;
    pSStack_6b0 = &this->LayerLeaderNode[1].color;
    uStack_6a8 = (WSNNode *)&this->LayerLeaderNode[0].color;
    do {
      cv::Mat::clone();
      SelectLeaderID(this);
      SStack_6d8.width = 0;
      SStack_6d8.height = 0;
      SStack_6e8.width = 0x3010000;
      dStack_650 = 0.0;
      dStack_658 = *(double *)(this->LayerLeaderNode + 4);
      uStack_718 = (WSNTopologyBasedEnergy *)0x4046800000000000;
      auStack_710._0_4_ = 0;
      auStack_710._4_4_ = 0x4062c000;
      auStack_708._0_4_ = 0;
      auStack_708._4_4_ = 0x40468000;
      SStack_700.width = 0;
      SStack_700.height = 0;
      in_stack_fffffffffffff8b8 = in_stack_fffffffffffff8b8 & 0xffffffff00000000;
      pWStack_6e0 = (WSNTopologyBasedEnergy *)apdStack_3c8;
      cv::line(&SStack_6e8,&dStack_650,&dStack_658,(string *)&uStack_718,1,8,
               in_stack_fffffffffffff8b8);
      lVar27 = 0x1924;
      do {
        SStack_6d8.width = 0;
        SStack_6d8.height = 0;
        SStack_6e8.width = 0x3010000;
        dStack_660 = *(double *)((long)this + lVar27 + -0x3c);
        dStack_668 = *(double *)((long)this + lVar27 + -4);
        uStack_718 = (WSNTopologyBasedEnergy *)0x0;
        auStack_710._0_4_ = 0;
        auStack_710._4_4_ = 0x406fe000;
        auStack_708._0_4_ = 0;
        auStack_708._4_4_ = 0;
        SStack_700.width = 0;
        SStack_700.height = 0;
        in_stack_fffffffffffff8b8 = in_stack_fffffffffffff8b8 & 0xffffffff00000000;
        pWStack_6e0 = (WSNTopologyBasedEnergy *)apdStack_3c8;
        cv::line(&SStack_6e8,&dStack_660,&dStack_668,(string *)&uStack_718,1,8,
                 in_stack_fffffffffffff8b8);
        uStack_718 = (WSNTopologyBasedEnergy *)auStack_708;
        std::__cxx11::string::_M_construct<char_const*>((string *)&uStack_718,"WSN","");
        SStack_6d8.width = 0;
        SStack_6d8.height = 0;
        SStack_6e8.width = 0x1010000;
        pWStack_6e0 = (WSNTopologyBasedEnergy *)apdStack_3c8;
        cv::imshow((string *)&uStack_718,(_InputArray *)&SStack_6e8);
        if (uStack_718 != (WSNTopologyBasedEnergy *)auStack_708) {
          operator_delete(uStack_718,(ulong)((long)auStack_708 + 1));
        }
        pWVar33 = pWStack_698;
        pWVar32 = pWStack_6a0;
        lVar27 = lVar27 + 0x38;
      } while (lVar27 != 0x1a04);
      if (this->Test != false) {
        cv::waitKey(100);
      }
      iVar22 = WSNNode::layer(this->node + *piStack_728);
      if (iVar22 == 0) {
        auStack_720 = (undefined1  [8])this->alpha;
        dStack_3f8 = *(double *)&pWVar33->leaderID;
        dVar3 = *(double *)pWVar33;
        dStack_400 = pWVar33->energy;
        SStack_3f0.width = uStack_6a8->x;
        SStack_3f0.height = uStack_6a8->y;
        dStack_3e8 = uStack_6a8->energy;
        dStack_3e0 = *(double *)&uStack_6a8->leaderID;
        dStack_3d8 = (uStack_6a8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
        uStack_438._0_4_ = pWStack_6c8->leaderID;
        uStack_438._4_4_ = pWStack_6c8->id;
        SVar16.width = pWStack_6c8->x;
        SVar16.height = pWStack_6c8->y;
        dStack_440 = pWStack_6c8->energy;
        SStack_430 = (Size)(pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        SStack_428 = *(Size *)((pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val + 1)
        ;
        SStack_420 = *(Size *)((pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val + 2)
        ;
        SStack_418 = *(Size *)((pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val + 3)
        ;
        uStack_408._0_4_ = SUB84(dVar3,0);
        iVar22 = (int)uStack_408;
        uStack_408._4_4_ = (int)((ulong)dVar3 >> 0x20);
        iVar28 = uStack_408._4_4_;
        SStack_448 = SVar16;
        uStack_408 = dVar3;
        iVar23 = WSNNode::GetNodeID(pWVar33);
        this->node[iVar23].energy =
             this->node[iVar23].energy -
             ((double)auStack_720 *
              (double)((iVar22 - SVar16.width) * (iVar22 - SVar16.width) +
                      (iVar28 - SVar16.height) * (iVar28 - SVar16.height)) + 1.0);
        WSNNode::~WSNNode((WSNNode *)&SStack_448);
        WSNNode::~WSNNode((WSNNode *)&uStack_408);
        iVar22 = *piStack_728;
        auStack_128._16_8_ = *(undefined8 *)&this->node[iVar22].leaderID;
        pWVar32 = this->node + iVar22;
        auStack_128._0_4_ = pWVar32->x;
        auStack_128._4_4_ = pWVar32->y;
        auStack_128._8_8_ = pWVar32->energy;
        pSVar2 = &this->node[iVar22].color;
        dStack_110 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        dStack_108 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        dStack_100 = *pdVar1;
        dStack_f8 = pdVar1[1];
        dStack_158 = *(double *)&pWStack_698->leaderID;
        SStack_168.width = pWStack_698->x;
        SStack_168.height = pWStack_698->y;
        dStack_160 = pWStack_698->energy;
        SStack_150.width = uStack_6a8->x;
        SStack_150.height = uStack_6a8->y;
        dStack_148 = uStack_6a8->energy;
        dStack_140 = *(double *)&uStack_6a8->leaderID;
        dStack_138 = (uStack_6a8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
        this->node[*piStack_728].energy =
             this->node[*piStack_728].energy -
             ((double)((auStack_128._4_4_ - SStack_168.height) *
                       (auStack_128._4_4_ - SStack_168.height) +
                      (auStack_128._0_4_ - SStack_168.width) *
                      (auStack_128._0_4_ - SStack_168.width)) * this->alpha + 0.5);
        WSNNode::~WSNNode((WSNNode *)&SStack_168);
        WSNNode::~WSNNode((WSNNode *)auStack_128);
        iVar22 = WSNNode::GetNodeID(pWStack_6c8);
        this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
        iVar22 = WSNNode::GetNodeID(pWStack_6d0);
        this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
        iVar22 = WSNNode::GetNodeID((WSNNode *)pWStack_6f0);
        this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
        iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6f8);
LAB_0010b48c:
        this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
      }
      else {
        iVar22 = WSNNode::layer(this->node + *piStack_728);
        if (iVar22 == 1) {
          auStack_720 = (undefined1  [8])this->alpha;
          dStack_478 = *(double *)&pWStack_6c8->leaderID;
          dVar3 = *(double *)pWStack_6c8;
          dStack_480 = pWStack_6c8->energy;
          SStack_470 = (Size)(pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_468 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_460 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_458 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          SStack_4b8.width = pWStack_6d0->leaderID;
          SStack_4b8.height = pWStack_6d0->id;
          SVar15.width = pWStack_6d0->x;
          SVar15.height = pWStack_6d0->y;
          SStack_4c0 = (Size)pWStack_6d0->energy;
          SStack_4b0.width = pWStack_6b8->x;
          SStack_4b0.height = pWStack_6b8->y;
          dStack_4a8 = pWStack_6b8->energy;
          dStack_4a0 = *(double *)&pWStack_6b8->leaderID;
          dStack_498 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_488._0_4_ = SUB84(dVar3,0);
          iVar22 = (int)uStack_488;
          uStack_488._4_4_ = (int)((ulong)dVar3 >> 0x20);
          iVar28 = uStack_488._4_4_;
          SStack_4c8 = SVar15;
          uStack_488 = dVar3;
          iVar23 = WSNNode::GetNodeID(pWStack_6c8);
          this->node[iVar23].energy =
               this->node[iVar23].energy -
               ((double)auStack_720 *
                (double)((iVar22 - SVar15.width) * (iVar22 - SVar15.width) +
                        (iVar28 - SVar15.height) * (iVar28 - SVar15.height)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&SStack_4c8);
          WSNNode::~WSNNode((WSNNode *)&uStack_488);
          iVar22 = *piStack_728;
          WStack_1a8.leaderID = this->node[iVar22].leaderID;
          WStack_1a8.id = this->node[iVar22].id;
          pWVar32 = this->node + iVar22;
          WStack_1a8.x = pWVar32->x;
          WStack_1a8.y = pWVar32->y;
          WStack_1a8.energy = pWVar32->energy;
          pSVar2 = &this->node[iVar22].color;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar1;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar1[1];
          dStack_1d8 = *(double *)&pWStack_6c8->leaderID;
          SStack_1e8.width = pWStack_6c8->x;
          SStack_1e8.height = pWStack_6c8->y;
          dStack_1e0 = pWStack_6c8->energy;
          SStack_1d0 = (Size)(pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_1c8 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_1c0 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_1b8 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          this->node[*piStack_728].energy =
               this->node[*piStack_728].energy -
               ((double)((WStack_1a8.y - SStack_1e8.height) * (WStack_1a8.y - SStack_1e8.height) +
                        (WStack_1a8.x - SStack_1e8.width) * (WStack_1a8.x - SStack_1e8.width)) *
                this->alpha + 0.5);
          WSNNode::~WSNNode((WSNNode *)&SStack_1e8);
          WSNNode::~WSNNode(&WStack_1a8);
          iVar22 = WSNNode::GetNodeID(pWStack_6d0);
          this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
          iVar22 = WSNNode::GetNodeID((WSNNode *)pWStack_6f0);
          this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
          iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6f8);
          goto LAB_0010b48c;
        }
        iVar22 = WSNNode::layer(this->node + *piStack_728);
        if (iVar22 == 2) {
          auStack_720 = (undefined1  [8])this->alpha;
          dStack_4f8 = *(double *)&pWStack_6d0->leaderID;
          dVar3 = *(double *)pWStack_6d0;
          dStack_500 = pWStack_6d0->energy;
          SStack_4f0.width = pWStack_6b8->x;
          SStack_4f0.height = pWStack_6b8->y;
          dStack_4e8 = pWStack_6b8->energy;
          dStack_4e0 = *(double *)&pWStack_6b8->leaderID;
          dStack_4d8 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          SStack_538.width = *(int *)&pWStack_6f0->field_0x10;
          SStack_538.height = *(int *)&pWStack_6f0->field_0x14;
          SStack_548 = *(Size *)pWStack_6f0;
          SStack_540.width = *(int *)&pWStack_6f0->field_0x8;
          SStack_540.height = *(int *)&pWStack_6f0->field_0xc;
          SStack_530 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_528 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_520 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_518 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_508._0_4_ = SUB84(dVar3,0);
          iVar23 = (int)uStack_508;
          uStack_508._4_4_ = (int)((ulong)dVar3 >> 0x20);
          iVar21 = uStack_508._4_4_;
          iVar22 = SStack_548.width;
          iVar28 = SStack_548.height;
          uStack_508 = dVar3;
          iVar24 = WSNNode::GetNodeID(pWStack_6d0);
          this->node[iVar24].energy =
               this->node[iVar24].energy -
               ((double)auStack_720 *
                (double)((iVar23 - iVar22) * (iVar23 - iVar22) +
                        (iVar21 - iVar28) * (iVar21 - iVar28)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&SStack_548);
          WSNNode::~WSNNode((WSNNode *)&uStack_508);
          iVar22 = *piStack_728;
          auStack_218._0_4_ = this->node[iVar22].leaderID;
          auStack_218._4_4_ = this->node[iVar22].id;
          dVar3 = *(double *)(this->node + iVar22);
          dStack_220 = this->node[iVar22].energy;
          pSVar2 = &this->node[iVar22].color;
          auStack_218._8_8_ = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          auStack_218._16_8_ = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          dStack_200 = *pdVar1;
          dStack_1f8 = pdVar1[1];
          dStack_258 = *(double *)&pWStack_6d0->leaderID;
          SStack_268.width = pWStack_6d0->x;
          SStack_268.height = pWStack_6d0->y;
          dStack_260 = pWStack_6d0->energy;
          SStack_250.width = pWStack_6b8->x;
          SStack_250.height = pWStack_6b8->y;
          dStack_248 = pWStack_6b8->energy;
          dStack_240 = *(double *)&pWStack_6b8->leaderID;
          dStack_238 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_228._0_4_ = SUB84(dVar3,0);
          uStack_228._4_4_ = (int)((ulong)dVar3 >> 0x20);
          this->node[*piStack_728].energy =
               this->node[*piStack_728].energy -
               ((double)((uStack_228._4_4_ - SStack_268.height) *
                         (uStack_228._4_4_ - SStack_268.height) +
                        ((int)uStack_228 - SStack_268.width) * ((int)uStack_228 - SStack_268.width))
                * this->alpha + 0.5);
          uStack_228 = dVar3;
          WSNNode::~WSNNode((WSNNode *)&SStack_268);
          WSNNode::~WSNNode((WSNNode *)&uStack_228);
          iVar22 = WSNNode::GetNodeID((WSNNode *)pWStack_6f0);
          this->node[iVar22].energy = this->node[iVar22].energy + -1.0;
          iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6f8);
          goto LAB_0010b48c;
        }
        iVar22 = WSNNode::layer(this->node + *piStack_728);
        if (iVar22 == 3) {
          auStack_720 = (undefined1  [8])this->alpha;
          auStack_588._16_8_ = *(undefined8 *)&pWStack_6f0->field_0x10;
          auStack_588._0_8_ = *(undefined8 *)pWStack_6f0;
          auStack_588._8_8_ = *(undefined8 *)&pWStack_6f0->field_0x8;
          SStack_570 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_568 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_560 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_558 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          dStack_5b8 = *(double *)&pWStack_6f0->field_0x10;
          dVar3 = *(double *)pWStack_6f0;
          dStack_5c0 = *(double *)&pWStack_6f0->field_0x8;
          SStack_5b0 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_5a8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_5a0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_598 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uVar19 = auStack_588._0_4_;
          uVar20 = auStack_588._4_4_;
          uStack_5c8._0_4_ = SUB84(dVar3,0);
          iVar22 = (int)uStack_5c8;
          uStack_5c8._4_4_ = (int)((ulong)dVar3 >> 0x20);
          iVar28 = uStack_5c8._4_4_;
          uStack_5c8 = dVar3;
          iVar23 = WSNNode::GetNodeID((WSNNode *)pWStack_6f0);
          this->node[iVar23].energy =
               this->node[iVar23].energy -
               ((double)auStack_720 *
                (double)((uVar19 - iVar22) * (uVar19 - iVar22) +
                        (uVar20 - iVar28) * (uVar20 - iVar28)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&uStack_5c8);
          WSNNode::~WSNNode((WSNNode *)auStack_588);
          iVar22 = *piStack_728;
          dStack_298 = *(double *)&this->node[iVar22].leaderID;
          dVar3 = *(double *)(this->node + iVar22);
          dStack_2a0 = this->node[iVar22].energy;
          pSVar2 = &this->node[iVar22].color;
          dStack_290 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_288 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          dStack_280 = *pdVar1;
          dStack_278 = pdVar1[1];
          dStack_2d8 = *(double *)&pWStack_6f0->field_0x10;
          SStack_2e8 = *(Size *)pWStack_6f0;
          dStack_2e0 = *(double *)&pWStack_6f0->field_0x8;
          SStack_2d0 = (Size)(pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_2c8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_2c0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_2b8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_2a8._0_4_ = SUB84(dVar3,0);
          uStack_2a8._4_4_ = (int)((ulong)dVar3 >> 0x20);
          this->node[*piStack_728].energy =
               this->node[*piStack_728].energy -
               ((double)((uStack_2a8._4_4_ - SStack_2e8.height) *
                         (uStack_2a8._4_4_ - SStack_2e8.height) +
                        ((int)uStack_2a8 - SStack_2e8.width) * ((int)uStack_2a8 - SStack_2e8.width))
                * this->alpha + 0.5);
          uStack_2a8 = dVar3;
          WSNNode::~WSNNode((WSNNode *)&SStack_2e8);
          WSNNode::~WSNNode((WSNNode *)&uStack_2a8);
          iVar22 = WSNNode::GetNodeID((WSNNode *)SStack_6f8);
          goto LAB_0010b48c;
        }
        auStack_720 = (undefined1  [8])this->alpha;
        WStack_608._16_8_ = *(undefined8 *)((long)SStack_6f8 + 0x10);
        WStack_608._0_8_ = *(undefined8 *)SStack_6f8;
        WStack_608.energy = *(double *)((long)SStack_6f8 + 8);
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = pWVar32->x;
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_ = pWVar32->y;
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = pWVar32->energy;
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             *(double *)&pWVar32->leaderID;
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
        uStack_638._0_4_ = pWStack_688->leaderID;
        uStack_638._4_4_ = pWStack_688->id;
        SVar17.width = pWStack_688->x;
        SVar17.height = pWStack_688->y;
        dStack_640 = pWStack_688->energy;
        SStack_630 = *pSStack_690;
        SStack_628 = pSStack_690[1];
        SStack_620 = pSStack_690[2];
        SStack_618 = pSStack_690[3];
        iVar22 = WStack_608.x;
        iVar28 = WStack_608.y;
        SStack_648 = SVar17;
        iVar23 = WSNNode::GetNodeID((WSNNode *)SStack_6f8);
        this->node[iVar23].energy =
             this->node[iVar23].energy -
             ((double)auStack_720 *
              (double)((iVar22 - SVar17.width) * (iVar22 - SVar17.width) +
                      (iVar28 - SVar17.height) * (iVar28 - SVar17.height)) + 1.0);
        WSNNode::~WSNNode((WSNNode *)&SStack_648);
        WSNNode::~WSNNode(&WStack_608);
        iVar22 = *piStack_728;
        dStack_318 = *(double *)&this->node[iVar22].leaderID;
        dVar3 = *(double *)(this->node + iVar22);
        dStack_320 = this->node[iVar22].energy;
        pSVar2 = &this->node[iVar22].color;
        dStack_310 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        dStack_308 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        dStack_300 = *pdVar1;
        dStack_2f8 = pdVar1[1];
        uStack_358 = *(undefined8 *)((long)SStack_6f8 + 0x10);
        SStack_368 = *(Size *)SStack_6f8;
        SStack_360 = *(Size *)((long)SStack_6f8 + 8);
        SStack_350.width = pWStack_6a0->x;
        SStack_350.height = pWStack_6a0->y;
        dStack_348 = pWStack_6a0->energy;
        dStack_340 = *(double *)&pWStack_6a0->leaderID;
        dStack_338 = (pWStack_6a0->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
        uStack_328._0_4_ = SUB84(dVar3,0);
        uStack_328._4_4_ = (int)((ulong)dVar3 >> 0x20);
        this->node[*piStack_728].energy =
             this->node[*piStack_728].energy -
             ((double)((uStack_328._4_4_ - SStack_368.height) *
                       (uStack_328._4_4_ - SStack_368.height) +
                      ((int)uStack_328 - SStack_368.width) * ((int)uStack_328 - SStack_368.width)) *
              this->alpha + 0.5);
        uStack_328 = dVar3;
        WSNNode::~WSNNode((WSNNode *)&SStack_368);
        WSNNode::~WSNNode((WSNNode *)&uStack_328);
      }
      iVar22 = *piStack_728;
      dStack_98 = *(double *)&this->node[iVar22].leaderID;
      dStack_a8 = *(double *)(this->node + iVar22);
      dStack_a0 = this->node[iVar22].energy;
      pSVar2 = &this->node[iVar22].color;
      dStack_90 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      dStack_88 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar1 = this->node[iVar22].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      dStack_80 = *pdVar1;
      dStack_78 = pdVar1[1];
      pWVar30 = (WSNTopologyBasedEnergy *)(auStack_70 + 0x20);
      pWVar29 = pWVar30;
      WSNNode::NodeColor((Scalar *)pWVar30,this->node + *piStack_728);
      drawCrossNode(pWVar29,&this->img,(WSNNode *)&dStack_a8,(Scalar *)pWVar30);
      WSNNode::~WSNNode((WSNNode *)&dStack_a8);
      uStack_718 = (WSNTopologyBasedEnergy *)auStack_708;
      std::__cxx11::string::_M_construct<char_const*>((string *)&uStack_718,"WSN","");
      SStack_6d8.width = 0;
      SStack_6d8.height = 0;
      SStack_6e8.width = 0x1010000;
      pWStack_6e0 = this;
      cv::imshow((string *)&uStack_718,(_InputArray *)&SStack_6e8);
      if (uStack_718 != (WSNTopologyBasedEnergy *)auStack_708) {
        operator_delete(uStack_718,(ulong)((long)auStack_708 + 1));
      }
      cv::Mat::~Mat((Mat *)apdStack_3c8);
      piStack_728 = piStack_728 + 1;
    } while (piStack_728 !=
             vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pWVar32 = this->node;
  lVar27 = 100;
  do {
    dStack_d8 = *(double *)&pWVar32->leaderID;
    dStack_e8 = *(double *)pWVar32;
    dStack_e0 = pWVar32->energy;
    dStack_d0 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
    dStack_c8 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
    dStack_c0 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
    dStack_b8 = (pWVar32->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
    pWVar30 = (WSNTopologyBasedEnergy *)auStack_70;
    WSNNode::NodeColor((Scalar *)auStack_70,pWVar32);
    drawCrossNode(pWVar30,&this->img,(WSNNode *)&dStack_e8,(Scalar *)auStack_70);
    WSNNode::~WSNNode((WSNNode *)&dStack_e8);
    apdStack_3c8[0] = adStack_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)apdStack_3c8,"WSN","");
    auStack_708._0_4_ = 0;
    auStack_708._4_4_ = 0;
    uStack_718 = (WSNTopologyBasedEnergy *)CONCAT44(uStack_718._4_4_,0x1010000);
    auStack_710 = (undefined1  [8])this;
    cv::imshow((string *)apdStack_3c8,(_InputArray *)&uStack_718);
    if (apdStack_3c8[0] != adStack_3b8) {
      operator_delete(apdStack_3c8[0],(long)adStack_3b8[0] + 1);
    }
    pWVar32 = pWVar32 + 1;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  if (this->Test != false) {
    cv::waitKey(400);
  }
  if (vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_680.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

int WSNTopologyBasedEnergy::MinMark()
{
	int min=Mark[0];
	int j=0;
	for(int i=0;i<LayerNum;i++)
	{
		if(Mark[i]<min)
		{
			min=Mark[i];
			j=i;
		}
	}
	return j;
}